

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_malloc.c
# Opt level: O0

void * ga_malloc(Integer nelem,int type,char *name)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Integer IVar3;
  void *pointer;
  Boolean BVar4;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  Integer extra;
  Integer item_size;
  Integer bytes;
  Integer adjust;
  Integer handle;
  size_t addr;
  void *ptr;
  Integer in_stack_00000148;
  char *in_stack_00000150;
  ulong memhandle;
  ulong local_38;
  ulong local_30;
  ulong *local_28;
  ulong *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  IVar3 = pnga_type_f2c((long)in_ESI);
  memhandle = ga_types[IVar3 + -1000].size;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = memhandle;
  local_28 = in_stack_ffffffffffffffe0;
  if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x10)) % auVar1,0) != 0) {
    pnga_error(in_stack_00000150,in_stack_00000148);
    local_28 = in_stack_ffffffffffffffe0;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = memhandle;
  pointer = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x20)) / auVar2,0);
  if (ga_usesMA == 0) {
    local_28 = (ulong *)(*ga_ext_alloc)(((long)pointer + in_RDI) * memhandle,(int)memhandle,in_RDX);
  }
  else {
    BVar4 = MA_push_stack((long)pointer + in_RDI,CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
                          (Integer *)local_28);
    if (BVar4 == 0) {
      pnga_error(in_stack_00000150,in_stack_00000148);
    }
    else {
      MA_get_pointer(memhandle,pointer);
    }
  }
  local_38 = (ulong)local_28 & 0xf;
  if (local_38 != 0) {
    local_38 = 0x10 - local_38;
    local_28 = (ulong *)(local_38 + (long)local_28);
  }
  if (ga_usesMA == 0) {
    local_30 = local_38;
  }
  if (local_28 == (ulong *)0x0) {
    pnga_error(in_stack_00000150,in_stack_00000148);
  }
  *local_28 = local_30;
  return local_28 + 2;
}

Assistant:

void* ga_malloc(Integer nelem, int type, char *name)
{
    void *ptr;  
    size_t addr;
    Integer handle, adjust=0, bytes, item_size=GAsizeofM(pnga_type_f2c(type));
    Integer extra;

#if NOFORT
    type = pnga_type_f2c(type);
#endif

    /* extra space for 1.ALIGNMENT and 2.storing handle */
    if(ALIGNMENT%item_size)
       pnga_error("ga_malloc: GA datatype cannot be aligned.Adjust ALIGNMENT",0);
    extra = 2*ALIGNMENT/item_size;
    nelem += extra;

    if(ga_usesMA) { /* Uses Memory Allocator (MA) */
       if(MA_push_stack(type,nelem,name,&handle))  MA_get_pointer(handle,&ptr);
       else pnga_error("ga_malloc: MA_push_stack failed",0);
       addr = (size_t)ptr;
    }
    else { /* else, using external memory allocator */
       bytes = nelem*item_size;
       addr  = (size_t)(*ga_ext_alloc)(
               (size_t)bytes, (int)item_size, name);
    }

    /* Address Alignment */
    adjust = (Integer) (addr%ALIGNMENT);
    if(adjust != 0) { adjust=ALIGNMENT-adjust; addr+=adjust; }
    ptr = (void *)addr; 
    if(!ga_usesMA) handle = adjust;

    if(ptr == NULL) pnga_error("ga_malloc failed", 0L);
    *((Integer*)ptr)=handle;/*store handle or adjustment-value in this buffer*/
    ptr = ((char*)ptr) + ALIGNMENT;

    return ptr;
}